

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O0

Stream * rw::ps2::writeMipmap(Stream *stream,int32 param_2,void *object,int32 offset,int32 param_5)

{
  Ps2Raster *raster;
  Texture *tex;
  int32 param_4_local;
  int32 offset_local;
  void *object_local;
  int32 param_1_local;
  Stream *stream_local;
  
  if (*object == 0) {
    Stream::writeI32(stream,(uint)*(ushort *)(*object + (long)nativeRasterOffset + 0xc));
  }
  else {
    Stream::writeI32(stream,defaultMipMapKL);
  }
  return stream;
}

Assistant:

static Stream*
writeMipmap(Stream *stream, int32, void *object, int32 offset, int32)
{
	Texture *tex = (Texture*)object;
	if(tex->raster){
		stream->writeI32(defaultMipMapKL);
		return stream;
	}
	Ps2Raster *raster = GETPS2RASTEREXT(tex->raster);
	stream->writeI32(raster->kl);
	return stream;
}